

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O3

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,ValuePair *pair)

{
  ValueLength *pVVar1;
  ValueType VVar2;
  pointer pCVar3;
  long lVar4;
  ValueLength VVar5;
  Exception *this_00;
  ulong uVar6;
  ExceptionType type;
  ValueLength VVar7;
  ulong len;
  
  VVar7 = this->_pos;
  VVar2 = pair->_type;
  pCVar3 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->_stack).
       super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
       ._M_impl.super__Vector_impl_data._M_start != pCVar3) &&
     ((this->_start[pCVar3[-1].startPos] == '\x14' || (this->_start[pCVar3[-1].startPos] == '\v'))))
  {
    if ((this->_keyWritten != false) || ((VVar2 | Null) == String)) {
      this->_keyWritten = (bool)(this->_keyWritten ^ 1);
      goto LAB_00105cb4;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    type = BuilderKeyMustBeString;
LAB_00105e53:
    Exception::Exception(this_00,type);
LAB_00105e58:
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
LAB_00105cb4:
  if (VVar2 == Custom) {
    if (this->options->disallowCustom == true) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      type = BuilderCustomDisallowed;
      goto LAB_00105e53;
    }
    len = pair->_size;
    reserve(this,len);
    if (pair->_start != (uint8_t *)0x0) {
      memcpy(this->_start + this->_pos,pair->_start,len);
    }
    VVar7 = this->_pos;
    VVar5 = VVar7 + len;
  }
  else {
    if (VVar2 == Binary) {
      len = pair->_size;
      reserve(this,len + 9);
      appendUInt(this,len,0xbf);
    }
    else {
      if (VVar2 != String) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception
                  (this_00,BuilderUnexpectedType,
                   "Only ValueType::Binary, ValueType::String and ValueType::Custom are valid for ValuePair argument"
                  );
        goto LAB_00105e58;
      }
      len = pair->_size;
      if (len < 0x7f) {
        reserve(this,len + 1);
        VVar5 = this->_pos;
        this->_pos = VVar5 + 1;
        this->_start[VVar5] = (char)len + '@';
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
      }
      else {
        reserve(this,len + 9);
        VVar5 = this->_pos;
        this->_pos = VVar5 + 1;
        this->_start[VVar5] = 0xbf;
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
        lVar4 = 8;
        uVar6 = len;
        do {
          VVar5 = this->_pos;
          this->_pos = VVar5 + 1;
          this->_start[VVar5] = (uint8_t)uVar6;
          pVVar1 = &this->_bufferPtr->_size;
          *pVVar1 = *pVVar1 + 1;
          uVar6 = uVar6 >> 8;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
    }
    if (len == 0) goto LAB_00105df1;
    memcpy(this->_start + this->_pos,pair->_start,len);
    VVar5 = this->_pos + len;
  }
  this->_pos = VVar5;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + len;
LAB_00105df1:
  return this->_start + VVar7;
}

Assistant:

uint8_t* Builder::set(ValuePair const& pair) {
  // This method builds a single further VPack item at the current
  // append position. This is the case for ValueType::String,
  // ValueType::Binary, or ValueType::Custom, which can be built
  // with two pieces of information

  auto const oldPos = _pos;

  checkKeyHasValidType(pair.valueType() == ValueType::String ||
                       pair.valueType() == ValueType::UInt);

  if (pair.valueType() == ValueType::String) {
    uint64_t size = pair.getSize();
    if (size > 126) {
      // long string
      reserve(1 + 8 + size);
      appendByteUnchecked(0xbf);
      appendLengthUnchecked<8>(size);
    } else {
      // short string
      reserve(1 + size);
      appendByteUnchecked(static_cast<uint8_t>(0x40 + size));
    }
    if (size != 0) {
      VELOCYPACK_ASSERT(pair.getStart() != nullptr);
      std::memcpy(_start + _pos, pair.getStart(), checkOverflow(size));
      advance(size);
    }
    return _start + oldPos;
  } else if (pair.valueType() == ValueType::Binary) {
    uint64_t v = pair.getSize();
    reserve(9 + v);
    appendUInt(v, 0xbf);
    if (v != 0) {
      VELOCYPACK_ASSERT(pair.getStart() != nullptr);
      std::memcpy(_start + _pos, pair.getStart(), checkOverflow(v));
      advance(v);
    }
    return _start + oldPos;
  } else if (pair.valueType() == ValueType::Custom) {
    if (options->disallowCustom) {
      // Custom values explicitly disallowed as a security precaution
      throw Exception(Exception::BuilderCustomDisallowed);
    }
    // We only reserve space here, the caller has to fill in the custom type
    uint64_t size = pair.getSize();
    reserve(size);
    uint8_t const* p = pair.getStart();
    if (p != nullptr) {
      std::memcpy(_start + _pos, p, checkOverflow(size));
    }
    advance(size);
    return _start + _pos - size;
  }
  throw Exception(Exception::BuilderUnexpectedType,
                  "Only ValueType::Binary, ValueType::String and "
                  "ValueType::Custom are valid for ValuePair argument");
}